

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_vendor_name(tcv_t *tcv,char *vendor_name)

{
  void *pvVar1;
  char *vendor_name_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (vendor_name == (char *)0x0)) || (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    vendor_name[0x10] = '\0';
    pvVar1 = tcv->data;
    *(undefined8 *)vendor_name = *(undefined8 *)((long)pvVar1 + 0x15);
    *(undefined8 *)(vendor_name + 8) = *(undefined8 *)((long)pvVar1 + 0x1d);
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_vendor_name(tcv_t *tcv, char vendor_name[BASIC_INFO_REG_VENDOR_NAME_SIZE + 1])
{
	if (tcv == NULL || vendor_name == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Indicates end of string */
	vendor_name[BASIC_INFO_REG_VENDOR_NAME_SIZE] = '\0';

	memcpy(vendor_name, &((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_VENDOR_NAME], BASIC_INFO_REG_VENDOR_NAME_SIZE);

	return 0;
}